

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void PType::StaticInit(void)

{
  PInt *pPVar1;
  PBool *pPVar2;
  PFloat *pPVar3;
  PString *pPVar4;
  PName *pPVar5;
  PSound *pPVar6;
  PColor *pPVar7;
  PStatePointer *pPVar8;
  PStruct *pPVar9;
  PType *pPVar10;
  PPointer *this;
  PStruct *pPVar11;
  DObject *pDVar12;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  FName local_40;
  undefined4 local_3c;
  undefined4 local_38;
  FName local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  FName local_20;
  FName local_1c;
  
  addterm(ReleaseGlobalSymbols,"ReleaseGlobalSymbols");
  *(PClass **)
   &PErrorType::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PErrorType::RegistrationInfo.MyClass;
  *(PClass **)
   &PVoidType::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PVoidType::RegistrationInfo.MyClass;
  *(PClass **)
   &PInt::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PInt::RegistrationInfo.MyClass;
  *(PClass **)
   &PBool::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PBool::RegistrationInfo.MyClass;
  *(PClass **)
   &PFloat::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PFloat::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PString::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PString::RegistrationInfo.MyClass;
  *(PClass **)
   &PName::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PName::RegistrationInfo.MyClass;
  *(PClass **)
   &PSound::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PSound::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PSpriteID::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PSpriteID::RegistrationInfo.MyClass;
  *(PClass **)
   &PTextureID::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PTextureID::RegistrationInfo.MyClass;
  *(PClass **)
   &PColor::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PColor::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PPointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PPointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PClassPointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PClassPointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PEnum::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PEnum::RegistrationInfo.MyClass;
  *(PClass **)
   &PArray::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PArray::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PDynArray::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PDynArray::RegistrationInfo.MyClass;
  *(PClass **)
   &PMap::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PMap::RegistrationInfo.MyClass;
  *(PClass **)
   &PStruct::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStruct::RegistrationInfo.MyClass;
  *(PClass **)
   &PNativeStruct::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PNativeStruct::RegistrationInfo.MyClass;
  *(PClass **)
   &PPrototype::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PPrototype::RegistrationInfo.MyClass;
  *(PClass **)
   &PClass::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PClass::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PStatePointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStatePointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PStateLabel::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStateLabel::RegistrationInfo.MyClass;
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PType(pPVar10,0,1);
  (pPVar10->super_PTypeBase).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006f4388;
  TypeError = (PErrorType *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PType(pPVar10,0,2);
  (pPVar10->super_PTypeBase).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006f4388;
  TypeAuto = (PErrorType *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PType(pPVar10,0,1);
  (pPVar10->super_PTypeBase).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006f4470;
  TypeVoid = (PVoidType *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PInt::PInt((PInt *)pPVar10,1,false,true);
  TypeSInt8 = (PInt *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PInt::PInt((PInt *)pPVar10,1,true,true);
  TypeUInt8 = (PInt *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PInt::PInt((PInt *)pPVar10,2,false,true);
  TypeSInt16 = (PInt *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PInt::PInt((PInt *)pPVar10,2,true,true);
  TypeUInt16 = (PInt *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PInt::PInt((PInt *)pPVar10,4,false,true);
  TypeSInt32 = (PInt *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PInt::PInt((PInt *)pPVar10,4,true,true);
  TypeUInt32 = (PInt *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PBool::PBool((PBool *)pPVar10);
  TypeBool = (PBool *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PFloat::PFloat((PFloat *)pPVar10,4);
  TypeFloat32 = (PFloat *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PFloat::PFloat((PFloat *)pPVar10,8);
  TypeFloat64 = (PFloat *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PString::PString((PString *)pPVar10);
  TypeString = (PString *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PName::PName((PName *)pPVar10);
  TypeName = (PName *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PSound::PSound((PSound *)pPVar10);
  TypeSound = (PSound *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PColor::PColor((PColor *)pPVar10);
  TypeColor = (PColor *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0xa8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PStatePointer::PStatePointer((PStatePointer *)pPVar10);
  TypeState = (PStatePointer *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PStateLabel::PStateLabel((PStateLabel *)pPVar10);
  TypeStateLabel = (PStateLabel *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  this = (PPointer *)
         M_Malloc_Dbg(0xa8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                      ,0x1f9);
  PPointer::PPointer(this);
  TypeNullPtr = this;
  FTypeTable::AddType(&TypeTable,(PType *)this);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PSpriteID::PSpriteID((PSpriteID *)pPVar10);
  TypeSpriteID = (PSpriteID *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  pPVar10 = (PType *)M_Malloc_Dbg(0x98,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
  PTextureID::PTextureID((PTextureID *)pPVar10);
  TypeTextureID = (PTextureID *)pPVar10;
  FTypeTable::AddType(&TypeTable,pPVar10);
  local_1c.Index = FName::NameManager::FindName(&FName::NameData,"@ColorStruct",false);
  TypeColorStruct = NewStruct(&local_1c,(PTypeBase *)0x0);
  local_20.Index = 0x259;
  TypeStringStruct = &NewNativeStruct(&local_20,(PTypeBase *)0x0)->super_PStruct;
  local_24 = 0x292;
  (*(TypeColorStruct->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject._vptr_DObject[0x15])(TypeColorStruct,&local_24,TypeUInt8);
  local_28 = 0x291;
  (*(TypeColorStruct->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject._vptr_DObject[0x15])(TypeColorStruct,&local_28,TypeUInt8,0);
  local_2c = 0x290;
  (*(TypeColorStruct->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject._vptr_DObject[0x15])(TypeColorStruct,&local_2c,TypeUInt8);
  local_30 = 0x28f;
  (*(TypeColorStruct->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject._vptr_DObject[0x15])(TypeColorStruct,&local_30,TypeUInt8);
  pPVar11 = (PStruct *)
            M_Malloc_Dbg(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  local_34.Index = 0x261;
  PStruct::PStruct(pPVar11,&local_34,(PTypeBase *)0x0);
  local_38 = 0xf1;
  TypeVector2 = pPVar11;
  (*(pPVar11->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar11,&local_38,TypeFloat64);
  local_3c = 0xf2;
  (*(TypeVector2->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(TypeVector2,&local_3c,TypeFloat64,0);
  FTypeTable::AddType(&TypeTable,(PType *)TypeVector2);
  pPVar11 = TypeVector2;
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.loadOp = ' ';
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.storeOp = '3';
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.moveOp = '<';
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.RegType = '\x01';
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.RegCount = '\x02';
  pPVar11 = (PStruct *)
            M_Malloc_Dbg(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  local_40.Index = 0x262;
  PStruct::PStruct(pPVar11,&local_40,(PTypeBase *)0x0);
  local_44 = 0xf1;
  TypeVector3 = pPVar11;
  (*(pPVar11->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar11,&local_44,TypeFloat64,0);
  local_48 = 0xf2;
  (*(TypeVector3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(TypeVector3,&local_48,TypeFloat64);
  local_4c = 0xf3;
  (*(TypeVector3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(TypeVector3,&local_4c,TypeFloat64,0);
  pPVar9 = TypeVector3;
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar11 = TypeVector2;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0xf4;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f3f58;
  pDVar12[1]._vptr_DObject = (_func_int **)0x0;
  pDVar12[1].Class = (PClass *)pPVar11;
  pDVar12[1].ObjNext = (DObject *)0xffffffff00020000;
  PSymbolTable::AddSymbol
            (&(pPVar9->super_PNamedType).super_PCompoundType.super_PType.Symbols,(PSymbol *)pDVar12)
  ;
  FTypeTable::AddType(&TypeTable,(PType *)TypeVector3);
  pPVar11 = TypeVector3;
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.loadOp = '\"';
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.storeOp = '5';
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.moveOp = '=';
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.RegType = '\x01';
  (pPVar11->super_PNamedType).super_PCompoundType.super_PType.RegCount = '\x03';
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar1 = TypeSInt8;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x24a;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar1;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar1 = TypeUInt8;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x24b;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar1;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar1 = TypeSInt16;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x24c;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar1;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar1 = TypeUInt16;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x24d;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar1;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar1 = TypeSInt32;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x24e;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar1;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar1 = TypeUInt32;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x24f;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar1;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar2 = TypeBool;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x250;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar2;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar3 = TypeFloat64;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x255;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar3;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar3 = TypeFloat64;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 600;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar3;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar3 = TypeFloat32;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x256;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar3;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar3 = TypeFloat64;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 599;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar3;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar4 = TypeString;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x259;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar4;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar5 = TypeName;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x1ea;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar5;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar6 = TypeSound;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x25e;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar6;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar7 = TypeColor;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x204;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar8 = TypeState;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x25f;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar8;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar11 = TypeVector2;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x261;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar11;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  pDVar12 = (DObject *)
            M_Malloc_Dbg(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  pPVar11 = TypeVector3;
  DObject::DObject(pDVar12);
  *(undefined4 *)&pDVar12->field_0x24 = 0x262;
  pDVar12->_vptr_DObject = (_func_int **)&PTR_StaticType_006f42b8;
  pDVar12[1]._vptr_DObject = (_func_int **)pPVar11;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pDVar12);
  return;
}

Assistant:

void PType::StaticInit()
{
	// Add types to the global symbol table.
	atterm(ReleaseGlobalSymbols);

	// Set up TypeTable hash keys.
	RUNTIME_CLASS(PErrorType)->TypeTableType = RUNTIME_CLASS(PErrorType);
	RUNTIME_CLASS(PVoidType)->TypeTableType = RUNTIME_CLASS(PVoidType);
	RUNTIME_CLASS(PInt)->TypeTableType = RUNTIME_CLASS(PInt);
	RUNTIME_CLASS(PBool)->TypeTableType = RUNTIME_CLASS(PBool);
	RUNTIME_CLASS(PFloat)->TypeTableType = RUNTIME_CLASS(PFloat);
	RUNTIME_CLASS(PString)->TypeTableType = RUNTIME_CLASS(PString);
	RUNTIME_CLASS(PName)->TypeTableType = RUNTIME_CLASS(PName);
	RUNTIME_CLASS(PSound)->TypeTableType = RUNTIME_CLASS(PSound);
	RUNTIME_CLASS(PSpriteID)->TypeTableType = RUNTIME_CLASS(PSpriteID);
	RUNTIME_CLASS(PTextureID)->TypeTableType = RUNTIME_CLASS(PTextureID);
	RUNTIME_CLASS(PColor)->TypeTableType = RUNTIME_CLASS(PColor);
	RUNTIME_CLASS(PPointer)->TypeTableType = RUNTIME_CLASS(PPointer);
	RUNTIME_CLASS(PClassPointer)->TypeTableType = RUNTIME_CLASS(PClassPointer);
	RUNTIME_CLASS(PEnum)->TypeTableType = RUNTIME_CLASS(PEnum);
	RUNTIME_CLASS(PArray)->TypeTableType = RUNTIME_CLASS(PArray);
	RUNTIME_CLASS(PDynArray)->TypeTableType = RUNTIME_CLASS(PDynArray);
	RUNTIME_CLASS(PMap)->TypeTableType = RUNTIME_CLASS(PMap);
	RUNTIME_CLASS(PStruct)->TypeTableType = RUNTIME_CLASS(PStruct);
	RUNTIME_CLASS(PNativeStruct)->TypeTableType = RUNTIME_CLASS(PNativeStruct);
	RUNTIME_CLASS(PPrototype)->TypeTableType = RUNTIME_CLASS(PPrototype);
	RUNTIME_CLASS(PClass)->TypeTableType = RUNTIME_CLASS(PClass);
	RUNTIME_CLASS(PStatePointer)->TypeTableType = RUNTIME_CLASS(PStatePointer);
	RUNTIME_CLASS(PStateLabel)->TypeTableType = RUNTIME_CLASS(PStateLabel);

	// Create types and add them type the type table.
	TypeTable.AddType(TypeError = new PErrorType);
	TypeTable.AddType(TypeAuto = new PErrorType(2));
	TypeTable.AddType(TypeVoid = new PVoidType);
	TypeTable.AddType(TypeSInt8 = new PInt(1, false));
	TypeTable.AddType(TypeUInt8 = new PInt(1, true));
	TypeTable.AddType(TypeSInt16 = new PInt(2, false));
	TypeTable.AddType(TypeUInt16 = new PInt(2, true));
	TypeTable.AddType(TypeSInt32 = new PInt(4, false));
	TypeTable.AddType(TypeUInt32 = new PInt(4, true));
	TypeTable.AddType(TypeBool = new PBool);
	TypeTable.AddType(TypeFloat32 = new PFloat(4));
	TypeTable.AddType(TypeFloat64 = new PFloat(8));
	TypeTable.AddType(TypeString = new PString);
	TypeTable.AddType(TypeName = new PName);
	TypeTable.AddType(TypeSound = new PSound);
	TypeTable.AddType(TypeColor = new PColor);
	TypeTable.AddType(TypeState = new PStatePointer);
	TypeTable.AddType(TypeStateLabel = new PStateLabel);
	TypeTable.AddType(TypeNullPtr = new PPointer);
	TypeTable.AddType(TypeSpriteID = new PSpriteID);
	TypeTable.AddType(TypeTextureID = new PTextureID);

	TypeColorStruct = NewStruct("@ColorStruct", nullptr);	//This name is intentionally obfuscated so that it cannot be used explicitly. The point of this type is to gain access to the single channels of a color value.
	TypeStringStruct = NewNativeStruct(NAME_String, nullptr);
#ifdef __BIG_ENDIAN__
	TypeColorStruct->AddField(NAME_a, TypeUInt8);
	TypeColorStruct->AddField(NAME_r, TypeUInt8);
	TypeColorStruct->AddField(NAME_g, TypeUInt8);
	TypeColorStruct->AddField(NAME_b, TypeUInt8);
#else
	TypeColorStruct->AddField(NAME_b, TypeUInt8);
	TypeColorStruct->AddField(NAME_g, TypeUInt8);
	TypeColorStruct->AddField(NAME_r, TypeUInt8);
	TypeColorStruct->AddField(NAME_a, TypeUInt8);
#endif

	TypeVector2 = new PStruct(NAME_Vector2, nullptr);
	TypeVector2->AddField(NAME_X, TypeFloat64);
	TypeVector2->AddField(NAME_Y, TypeFloat64);
	TypeTable.AddType(TypeVector2);
	TypeVector2->loadOp = OP_LV2;
	TypeVector2->storeOp = OP_SV2;
	TypeVector2->moveOp = OP_MOVEV2;
	TypeVector2->RegType = REGT_FLOAT;
	TypeVector2->RegCount = 2;

	TypeVector3 = new PStruct(NAME_Vector3, nullptr);
	TypeVector3->AddField(NAME_X, TypeFloat64);
	TypeVector3->AddField(NAME_Y, TypeFloat64);
	TypeVector3->AddField(NAME_Z, TypeFloat64);
	// allow accessing xy as a vector2. This is not supposed to be serialized so it's marked transient
	TypeVector3->Symbols.AddSymbol(new PField(NAME_XY, TypeVector2, VARF_Transient, 0));
	TypeTable.AddType(TypeVector3);
	TypeVector3->loadOp = OP_LV3;
	TypeVector3->storeOp = OP_SV3;
	TypeVector3->moveOp = OP_MOVEV3;
	TypeVector3->RegType = REGT_FLOAT;
	TypeVector3->RegCount = 3;



	GlobalSymbols.AddSymbol(new PSymbolType(NAME_sByte, TypeSInt8));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Byte, TypeUInt8));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Short, TypeSInt16));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_uShort, TypeUInt16));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Int, TypeSInt32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_uInt, TypeUInt32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Bool, TypeBool));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Double, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float32, TypeFloat32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float64, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_String, TypeString));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Name, TypeName));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Sound, TypeSound));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Color, TypeColor));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_State, TypeState));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Vector2, TypeVector2));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Vector3, TypeVector3));
}